

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token.c
# Opt level: O3

int StringToken_Split(char *source,size_t length,char **delimiters,size_t n_delims,
                     _Bool include_empty,char ***tokens,size_t *token_count)

{
  ulong __size;
  _Bool _Var1;
  LOGGER_LOG p_Var2;
  STRING_TOKEN_HANDLE token;
  char **ppcVar3;
  char *__dest;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  char *__src;
  int iVar7;
  char *pcVar8;
  undefined1 auVar9 [16];
  
  auVar9._0_4_ = -(uint)(source == (char *)0x0);
  auVar9._4_4_ = -(uint)(delimiters == (char **)0x0);
  auVar9._8_4_ = -(uint)(tokens == (char ***)0x0);
  auVar9._12_4_ = -(uint)(token_count == (size_t *)0x0);
  iVar7 = movmskps((int)source,auVar9);
  if (iVar7 == 0 && n_delims != 0) {
    token = StringToken_GetFirst(source,length,delimiters,n_delims);
    iVar7 = 0;
    *token_count = 0;
    *tokens = (char **)0x0;
    if (token != (STRING_TOKEN_HANDLE)0x0) {
      pcVar8 = token->token_start;
      pcVar5 = token->source;
      sVar4 = token->length;
      if (pcVar8 == pcVar5 + sVar4) {
        __src = (char *)0x0;
      }
      else {
        __src = (char *)0x0;
        if (pcVar8 != token->delimiter_start) {
          __src = pcVar8;
        }
      }
LAB_001160d5:
      if (pcVar8 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else if (token->delimiter_start == (char *)0x0) {
        pcVar5 = pcVar5 + (sVar4 - (long)pcVar8);
      }
      else {
        pcVar5 = token->delimiter_start + -(long)pcVar8;
      }
      if ((__src != (char *)0x0) && (pcVar5 == (char *)0x0)) {
        pcVar5 = (char *)0x0;
LAB_00116224:
        p_Var2 = xlogging_get_log_function();
        iVar7 = 0x14c;
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                    ,"StringToken_Split",0x14b,1,"Unexpected token value (%p) or length (%lu)",__src
                    ,pcVar5);
        }
        goto LAB_0011632d;
      }
      if ((__src == (char *)0x0) && (pcVar5 != (char *)0x0)) {
        __src = (char *)0x0;
        goto LAB_00116224;
      }
      if (include_empty || __src != (char *)0x0) {
        sVar4 = *token_count;
        uVar6 = sVar4 + 1;
        *token_count = uVar6;
        uVar6 = uVar6 >> 0x3d;
        __size = sVar4 * 8 + 8;
        if ((uVar6 != 0) || (ppcVar3 = (char **)realloc(*tokens,__size), ppcVar3 == (char **)0x0)) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                      ,"StringToken_Split",0x15b,1,"Failed re-allocating the token array, size=%zu",
                      -(ulong)(uVar6 != 0) | __size);
          }
          *token_count = *token_count - 1;
          iVar7 = 0x15d;
LAB_0011632d:
          while( true ) {
            free(token);
            sVar4 = *token_count;
            if ((sVar4 == 0) || (ppcVar3 = *tokens, ppcVar3 == (char **)0x0)) break;
            *token_count = sVar4 - 1;
            token = (STRING_TOKEN_HANDLE)ppcVar3[sVar4 - 1];
          }
          free(*tokens);
          return iVar7;
        }
        *tokens = ppcVar3;
        if (pcVar5 != (char *)0x0) {
          pcVar8 = pcVar5 + 1;
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)0xffffffffffffffff;
          }
          if (pcVar8 != (char *)0xffffffffffffffff) {
            __dest = (char *)malloc((size_t)pcVar8);
            ppcVar3[*token_count - 1] = __dest;
            if (__dest != (char *)0x0) {
              memcpy(__dest,__src,(size_t)pcVar5);
              __dest[(long)pcVar5] = '\0';
              goto LAB_001161d4;
            }
          }
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                      ,"StringToken_Split",0x16c,1,"Failed copying token into array, size=%zu",
                      pcVar8);
          }
          *token_count = *token_count - 1;
          iVar7 = 0x16e;
          goto LAB_0011632d;
        }
        ppcVar3[*token_count - 1] = (char *)0x0;
      }
LAB_001161d4:
      _Var1 = StringToken_GetNext(token,delimiters,n_delims);
      if (_Var1) {
        pcVar8 = token->token_start;
        pcVar5 = token->source;
        sVar4 = token->length;
        __src = (char *)0x0;
        if ((pcVar8 != pcVar5 + sVar4) && (__src = (char *)0x0, pcVar8 != token->delimiter_start)) {
          __src = pcVar8;
        }
        goto LAB_001160d5;
      }
      free(token);
      iVar7 = 0;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar7 = 0x131;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                ,"StringToken_Split",0x130,1,
                "Invalid argument (source=%p, delimiters=%p, n_delims=%lu, tokens=%p, token_count=%p)"
                ,source,delimiters,n_delims,tokens,token_count);
    }
  }
  return iVar7;
}

Assistant:

int StringToken_Split(const char* source, size_t length, const char** delimiters, size_t n_delims, bool include_empty, char*** tokens, size_t* token_count)
{
    int result;

    // Codes_SRS_STRING_TOKENIZER_09_022: [ If source, delimiters, token or token_count are NULL, or n_delims is zero the function shall return a non-zero value ]
    if (source == NULL || delimiters == NULL || n_delims == 0 || tokens == NULL || token_count == NULL)
    {
        LogError("Invalid argument (source=%p, delimiters=%p, n_delims=%lu, tokens=%p, token_count=%p)", source, delimiters, (unsigned long)n_delims, tokens, token_count);
        result = MU_FAILURE;
    }
    else
    {
        STRING_TOKEN_HANDLE tokenizer;

        // Codes_SRS_STRING_TOKENIZER_09_023: [ source (up to length) shall be split into individual tokens separated by any of delimiters ]
        tokenizer = StringToken_GetFirst(source, length, delimiters, n_delims);

        *token_count = 0;
        *tokens = NULL;
        // Codes_SRS_STRING_TOKENIZER_09_027: [ If no failures occur the function shall return zero ]
        result = 0;

        if (tokenizer != NULL)
        {
            do
            {
                const char* tokenValue;
                size_t tokenLength;

                tokenValue = StringToken_GetValue(tokenizer);
                tokenLength = StringToken_GetLength(tokenizer);

                if ((tokenValue != NULL && tokenLength == 0) || (tokenValue == NULL && tokenLength > 0))
                {
                    LogError("Unexpected token value (%p) or length (%lu)", tokenValue, (unsigned long)tokenLength);
                    result = MU_FAILURE;
                    break;
                }
                // Codes_SRS_STRING_TOKENIZER_09_024: [ All NULL tokens shall be ommited if include_empty is not TRUE ]
                else if (tokenValue != NULL || include_empty)
                {
                    char** temp_token;
                    // Codes_SRS_STRING_TOKENIZER_09_025: [ The tokens shall be stored in tokens, and their count stored in token_count ]
                    *token_count = (*token_count) + 1;

                    size_t realloc_size = safe_multiply_size_t(sizeof(char*), (*token_count));
                    if (realloc_size == SIZE_MAX ||
                        (temp_token = (char**)realloc(*tokens, realloc_size)) == NULL)
                    {
                        // Codes_SRS_STRING_TOKENIZER_09_026: [ If any failures splitting or storing the tokens occur the function shall return a non-zero value ]
                        LogError("Failed re-allocating the token array, size=%zu", realloc_size);
                        (*token_count)--;
                        result = MU_FAILURE;
                        break;
                    }
                    else
                    {
                        *tokens = temp_token;
                        size_t malloc_size;
                        if (tokenLength == 0)
                        {
                            (*tokens)[(*token_count) - 1] = NULL;
                        }
                        else if ((malloc_size = safe_multiply_size_t(safe_add_size_t(tokenLength, 1), sizeof(char))) == SIZE_MAX ||
                            ((*tokens)[(*token_count) - 1] = (char*)malloc(malloc_size)) == NULL)
                        {
                            // Codes_SRS_STRING_TOKENIZER_09_026: [ If any failures splitting or storing the tokens occur the function shall return a non-zero value ]
                            LogError("Failed copying token into array, size=%zu", malloc_size);
                            *token_count = (*token_count) - 1;
                            result = MU_FAILURE;
                            break;
                        }
                        else
                        {
                            (void)memcpy((*tokens)[(*token_count) - 1], tokenValue, tokenLength);
                            (*tokens)[(*token_count) - 1][tokenLength] = '\0';
                        }
                    }
                }
            } while (StringToken_GetNext(tokenizer, delimiters, n_delims));

            StringToken_Destroy(tokenizer);

            if (result != 0)
            {
                while ((*token_count) > 0 && *tokens != NULL)
                {
                    *token_count = (*token_count) - 1;
                    free((*tokens)[*token_count]);
                }
                free(*tokens);
            }
        }
    }

    return result;
}